

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_rec rf_get_collision_rec(rf_rec rec1,rf_rec rec2)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  rf_rec rVar6;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 local_18;
  undefined4 uStack_14;
  
  _Var1 = rf_check_collision_recs(rec1,rec2);
  local_28 = 0.0;
  fVar2 = 0.0;
  fVar3 = 0.0;
  fVar4 = 0.0;
  if (_Var1) {
    local_28 = rec1.x;
    uStack_24 = rec1.y;
    local_18 = rec2.x;
    uStack_14 = rec2.y;
    fVar5 = local_28 - local_18;
    local_38 = rec2.width;
    uStack_34 = rec2.height;
    local_48 = rec1.width;
    uStack_44 = rec1.height;
    if (local_28 <= local_18) {
      local_28 = local_18;
      fVar2 = uStack_14;
      fVar4 = uStack_44;
      fVar3 = local_48;
      if (uStack_14 < uStack_24) {
        fVar2 = uStack_24;
        fVar4 = uStack_34;
      }
    }
    else {
      fVar2 = uStack_24;
      fVar4 = uStack_34;
      fVar3 = local_38;
      if (uStack_14 >= uStack_24) {
        fVar2 = uStack_14;
        fVar4 = uStack_44;
      }
    }
    fVar3 = fVar3 - ABS(fVar5);
    fVar4 = fVar4 - ABS(uStack_24 - uStack_14);
    if (local_48 <= local_38) {
      if (local_48 <= fVar3) {
        fVar3 = local_48;
      }
    }
    else if (local_38 <= fVar3) {
      fVar3 = local_38;
    }
    if (uStack_44 <= uStack_34) {
      if (uStack_44 <= fVar4) {
        fVar4 = uStack_44;
      }
    }
    else if (uStack_34 <= fVar4) {
      fVar4 = uStack_34;
    }
  }
  rVar6.y = fVar2;
  rVar6.x = local_28;
  rVar6.height = fVar4;
  rVar6.width = fVar3;
  return rVar6;
}

Assistant:

rf_rec rf_get_collision_rec(rf_rec rec1, rf_rec rec2)
{
    rf_rec retRec = {0, 0, 0, 0};

    if (rf_check_collision_recs(rec1, rec2))
    {
        float dxx = (float) fabs(rec1.x - rec2.x);
        float dyy = (float) fabs(rec1.y - rec2.y);

        if (rec1.x <= rec2.x)
        {
            if (rec1.y <= rec2.y)
            {
                retRec.x = rec2.x;
                retRec.y = rec2.y;
                retRec.width = rec1.width - dxx;
                retRec.height = rec1.height - dyy;
            } else
            {
                retRec.x = rec2.x;
                retRec.y = rec1.y;
                retRec.width = rec1.width - dxx;
                retRec.height = rec2.height - dyy;
            }
        } else
        {
            if (rec1.y <= rec2.y)
            {
                retRec.x = rec1.x;
                retRec.y = rec2.y;
                retRec.width = rec2.width - dxx;
                retRec.height = rec1.height - dyy;
            } else
            {
                retRec.x = rec1.x;
                retRec.y = rec1.y;
                retRec.width = rec2.width - dxx;
                retRec.height = rec2.height - dyy;
            }
        }

        if (rec1.width > rec2.width)
        {
            if (retRec.width >= rec2.width) retRec.width = rec2.width;
        } else
        {
            if (retRec.width >= rec1.width) retRec.width = rec1.width;
        }

        if (rec1.height > rec2.height)
        {
            if (retRec.height >= rec2.height) retRec.height = rec2.height;
        } else
        {
            if (retRec.height >= rec1.height) retRec.height = rec1.height;
        }
    }

    return retRec;
}